

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O0

int Saig_ManAddUniqueness
              (sat_solver *pSat,Vec_Int_t *vState,int nRegs,int i,int k,int *pnSatVarNum,
              int *pnClauses,int fVerbose)

{
  int iVarB;
  int iVarC;
  int iVar1;
  int iVar2;
  lit lVar3;
  int *piVar4;
  int *piVar5;
  lit *begin;
  int iVar6;
  int *pClause;
  int RetValue;
  int nSatVarsOld;
  int iVars;
  int v;
  int *pStateK;
  int *pStateI;
  int *pnSatVarNum_local;
  int k_local;
  int i_local;
  int nRegs_local;
  Vec_Int_t *vState_local;
  sat_solver *pSat_local;
  
  piVar4 = Vec_IntArray(vState);
  iVar6 = nRegs * i;
  piVar5 = Vec_IntArray(vState);
  if (((i == 0) || (k == 0)) || (k <= i)) {
    __assert_fail("i && k && i < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x60,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  iVar1 = Vec_IntSize(vState);
  if (iVar1 < nRegs * k) {
    __assert_fail("nRegs * k <= Vec_IntSize(vState)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                  ,0x61,
                  "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
                 );
  }
  for (nSatVarsOld = 0; nSatVarsOld < nRegs; nSatVarsOld = nSatVarsOld + 1) {
    if ((-1 < piVar4[(long)iVar6 + (long)nSatVarsOld]) &&
       (piVar5[(long)(nRegs * k) + (long)nSatVarsOld] == -1)) {
      if (fVerbose != 0) {
        printf("Cannot constrain an incomplete state.\n");
      }
      return 0;
    }
  }
  iVar1 = *pnSatVarNum;
  for (nSatVarsOld = 0; nSatVarsOld < nRegs; nSatVarsOld = nSatVarsOld + 1) {
    if (-1 < piVar4[(long)iVar6 + (long)nSatVarsOld]) {
      *pnClauses = *pnClauses + 4;
      iVar2 = piVar4[(long)iVar6 + (long)nSatVarsOld];
      iVarB = piVar5[(long)(nRegs * k) + (long)nSatVarsOld];
      iVarC = *pnSatVarNum;
      *pnSatVarNum = iVarC + 1;
      iVar2 = Cnf_DataAddXorClause(pSat,iVar2,iVarB,iVarC);
      if (iVar2 == 0) {
        if (fVerbose != 0) {
          printf("SAT solver became UNSAT after adding a uniqueness constraint.\n");
        }
        return 1;
      }
    }
  }
  *pnClauses = *pnClauses + 1;
  RetValue = 0;
  begin = (lit *)malloc((long)nRegs << 2);
  for (nSatVarsOld = iVar1; nSatVarsOld < *pnSatVarNum; nSatVarsOld = nSatVarsOld + 1) {
    lVar3 = toLitCond(nSatVarsOld,0);
    begin[RetValue] = lVar3;
    RetValue = RetValue + 1;
  }
  if (RetValue <= nRegs) {
    iVar6 = sat_solver_addclause(pSat,begin,begin + RetValue);
    if (begin != (lit *)0x0) {
      free(begin);
    }
    if (iVar6 == 0) {
      if (fVerbose != 0) {
        printf("SAT solver became UNSAT after adding a uniqueness constraint.\n");
      }
      pSat_local._4_4_ = 1;
    }
    else {
      pSat_local._4_4_ = 0;
    }
    return pSat_local._4_4_;
  }
  __assert_fail("iVars <= nRegs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigInd.c"
                ,0x7e,
                "int Saig_ManAddUniqueness(sat_solver *, Vec_Int_t *, int, int, int, int *, int *, int)"
               );
}

Assistant:

int Saig_ManAddUniqueness( sat_solver * pSat, Vec_Int_t * vState, int nRegs, int i, int k, int * pnSatVarNum, int * pnClauses, int fVerbose )
{
    int * pStateI = (int *)Vec_IntArray(vState) + nRegs * i;
    int * pStateK = (int *)Vec_IntArray(vState) + nRegs * k;
    int v, iVars, nSatVarsOld, RetValue, * pClause;
    assert( i && k && i < k );
    assert( nRegs * k <= Vec_IntSize(vState) );
    // check if the states are available
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 && pStateK[v] == -1 )
        {
            if ( fVerbose )
                printf( "Cannot constrain an incomplete state.\n" );
            return 0;
        }
    // add XORs
    nSatVarsOld = *pnSatVarNum;
    for ( v = 0; v < nRegs; v++ )
        if ( pStateI[v] >= 0 )
        {
            *pnClauses += 4;
            RetValue = Cnf_DataAddXorClause( pSat, pStateI[v], pStateK[v], (*pnSatVarNum)++ );
            if ( RetValue == 0 )
            {
                if ( fVerbose )
                    printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
                return 1;
            }
        }
    // add OR clause
    (*pnClauses)++;
    iVars = 0;
    pClause = ABC_ALLOC( int, nRegs );
    for ( v = nSatVarsOld; v < *pnSatVarNum; v++ )
        pClause[iVars++] = toLitCond( v, 0 );
    assert( iVars <= nRegs );
    RetValue = sat_solver_addclause( pSat, pClause, pClause + iVars );
    ABC_FREE( pClause );
    if ( RetValue == 0 )
    {
        if ( fVerbose )
            printf( "SAT solver became UNSAT after adding a uniqueness constraint.\n" );
        return 1;
    }
    return 0;
}